

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
register_coop(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
              *this,coop_unique_ptr_t *coop)

{
  _Head_base<0UL,_so_5::coop_t_*,_false> local_10;
  
  local_10._M_head_impl =
       (coop->_M_t).super___uniq_ptr_impl<so_5::coop_t,_so_5::coop_deleter_t>._M_t.
       super__Tuple_impl<0UL,_so_5::coop_t_*,_so_5::coop_deleter_t>.
       super__Head_base<0UL,_so_5::coop_t_*,_false>._M_head_impl;
  (coop->_M_t).super___uniq_ptr_impl<so_5::coop_t,_so_5::coop_deleter_t>._M_t.
  super__Tuple_impl<0UL,_so_5::coop_t_*,_so_5::coop_deleter_t>.
  super__Head_base<0UL,_so_5::coop_t_*,_false>._M_head_impl = (coop_t *)0x0;
  so_5::impl::coop_repository_basis_t::register_coop
            (&(this->m_coop_repo).super_coop_repository_basis_t,(coop_unique_ptr_t *)&local_10);
  std::unique_ptr<so_5::coop_t,_so_5::coop_deleter_t>::~unique_ptr
            ((unique_ptr<so_5::coop_t,_so_5::coop_deleter_t> *)&local_10);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::register_coop(
	coop_unique_ptr_t coop )
	{
		m_coop_repo.register_coop( std::move(coop) );
	}